

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

int ON_NurbsSpanIndex(int order,int cv_count,double *knot,double t,int side,int hint)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int length;
  ulong uVar5;
  double *array;
  uint uVar6;
  
  array = knot + (long)order + -2;
  length = (cv_count - order) + 2;
  if (hint <= cv_count - order && 0 < hint) {
    for (uVar5 = (ulong)(uint)hint; 0 < (long)uVar5; uVar5 = uVar5 - 1) {
      dVar1 = array[uVar5];
      if ((knot[(long)order + (uVar5 - 3)] != dVar1) ||
         (NAN(knot[(long)order + (uVar5 - 3)]) || NAN(dVar1))) {
        iVar4 = (int)uVar5;
        if (dVar1 <= t) {
          uVar3 = (uint)(dVar1 == t && side < 0);
          uVar6 = iVar4 - uVar3;
          array = array + uVar6;
          length = (length + uVar3) - iVar4;
        }
        else {
          length = iVar4 + 1;
          uVar6 = 0;
        }
        goto LAB_004d79b4;
      }
    }
  }
  uVar6 = 0;
LAB_004d79b4:
  uVar3 = ON_SearchMonotoneArray(array,length,t);
  uVar5 = (ulong)uVar3;
  if (-1 < (int)uVar3) {
    if (length + -1 <= (int)uVar3) {
      uVar5 = (ulong)(length - 2);
      goto LAB_004d7a24;
    }
    if ((-1 < side) || (uVar3 == 0)) goto LAB_004d7a24;
    uVar5 = (ulong)uVar3;
    do {
      if ((array[uVar5] != t) || (NAN(array[uVar5]) || NAN(t))) goto LAB_004d7a24;
      bVar2 = 1 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
  }
  uVar5 = 0;
LAB_004d7a24:
  return (int)uVar5 + uVar6;
}

Assistant:

int ON_NurbsSpanIndex(
          int order,          // (>=2)
          int cv_count,
          const double* knot, // knot[] array or length ON_KnotCount(order,cv_count)
          double t,           // evaluation parameter
          int side,           // side 0 = default, -1 = from below, +1 = from above
          int hint            // hint (or 0 if no hint available)
          )
{
  int j, len;
  
  // shift knot so that domain is knot[0] to knot[len]
  knot += (order-2);
  len = cv_count-order+2;
  
  // see if hint helps 
  if (hint > 0 && hint < len-1) {
    while(hint > 0 && knot[hint-1] == knot[hint]) hint--;
    if (hint > 0) {
      // have knot[hint-1] < knot[hint]
      if (t < knot[hint]) {
        len = hint+1;
        hint = 0;
      }
      else {
        if (side < 0 && t == knot[hint]) 
          hint--;
        knot += hint;
        len -= hint;
      }
    }
  }
  else
    hint = 0;
  
  j = ON_SearchMonotoneArray(knot,len,t);
  if (j < 0)
    j = 0;
  else if (j >= len-1)
    j = len-2;
  else if (side < 0) {
    // if user wants limit from below and t = an internal knot,
    // back up to previous span
    while(j > 0 && t == knot[j]) 
      j--;
  }
  return (j + hint);
}